

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall Preprocessor::parseDefineArguments(Preprocessor *this,Macro *m)

{
  bool bVar1;
  Token TVar2;
  Symbol *pSVar3;
  long in_RSI;
  long in_FS_OFFSET;
  Token t;
  Symbol arg;
  QByteArray l;
  Symbols arguments;
  rvalue_ref in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  Token in_stack_fffffffffffffef4;
  Parser *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int local_f0;
  char *in_stack_ffffffffffffff48;
  Parser *in_stack_ffffffffffffff50;
  QByteArray local_88 [3];
  char *local_40;
  QByteArray local_38;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<Symbol>::QList((QList<Symbol> *)0x16b63a);
  do {
    bVar1 = Parser::hasNext((Parser *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
    ;
    if (!bVar1) break;
    do {
      bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    } while (bVar1);
    TVar2 = Parser::next(in_stack_fffffffffffffef8);
    if (TVar2 == PP_RPAREN) break;
    if (TVar2 != IDENTIFIER) {
      local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      Parser::lexem(in_stack_fffffffffffffef8);
      local_40 = "...";
      bVar1 = ::operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (char **)in_stack_fffffffffffffef8);
      if (bVar1) {
        *(undefined1 *)(in_RSI + 1) = 1;
        pSVar3 = Parser::symbol((Parser *)0x16b70a);
        in_stack_ffffffffffffff04 = pSVar3->lineNum;
        QByteArray::QByteArray(local_88,"__VA_ARGS__",-1);
        Symbol::Symbol((Symbol *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                       (Token)in_stack_fffffffffffffef8,
                       (QByteArray *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        QList<Symbol>::operator+=
                  ((QList<Symbol> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        Symbol::~Symbol((Symbol *)0x16b76b);
        QByteArray::~QByteArray((QByteArray *)0x16b778);
        do {
          bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        } while (bVar1);
        bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
        if (!bVar1) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            Parser::error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
          goto LAB_0016ba75;
        }
        local_f0 = 3;
      }
      else {
        in_stack_fffffffffffffef8 = (Parser *)QByteArray::constData((QByteArray *)0x16b7e4);
        QByteArray::size(&local_38);
        bVar1 = is_identifier((char *)in_stack_fffffffffffffee8,0x16b803);
        if (!bVar1) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            Parser::error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          }
          goto LAB_0016ba75;
        }
        local_f0 = 0;
      }
      QByteArray::~QByteArray((QByteArray *)0x16b849);
      if (local_f0 != 0) break;
    }
    memset(&stack0xffffffffffffff48,0xaa,0x30);
    Parser::symbol((Parser *)0x16b878);
    Symbol::Symbol((Symbol *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
    bVar1 = QListSpecialMethodsBase<Symbol>::contains<Symbol>
                      ((QListSpecialMethodsBase<Symbol> *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8);
    if (bVar1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        Parser::error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      goto LAB_0016ba75;
    }
    Parser::symbol((Parser *)0x16b8d2);
    QList<Symbol>::operator+=
              ((QList<Symbol> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    do {
      bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    } while (bVar1);
    TVar2 = Parser::next(in_stack_fffffffffffffef8);
    if (TVar2 == PP_RPAREN) {
      local_f0 = 3;
    }
    else if (TVar2 == COMMA) {
      local_f0 = 2;
    }
    else {
      Parser::lexem(in_stack_fffffffffffffef8);
      bVar1 = ::operator==((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (char **)in_stack_fffffffffffffef8);
      in_stack_fffffffffffffef4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
      QByteArray::~QByteArray((QByteArray *)0x16b967);
      if ((in_stack_fffffffffffffef4 & 0x1000000) == NOTOKEN) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          Parser::error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
        goto LAB_0016ba75;
      }
      *(undefined1 *)(in_RSI + 1) = 1;
      do {
        bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      } while (bVar1);
      bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
      if (!bVar1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          Parser::error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        }
        goto LAB_0016ba75;
      }
      local_f0 = 3;
    }
    Symbol::~Symbol((Symbol *)0x16ba0e);
  } while (local_f0 == 2);
  QList<Symbol>::operator=
            ((QList<Symbol> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (QList<Symbol> *)in_stack_fffffffffffffee8);
  do {
    bVar1 = Parser::test(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  } while (bVar1);
  QList<Symbol>::~QList((QList<Symbol> *)0x16ba57);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0016ba75:
  __stack_chk_fail();
}

Assistant:

void Preprocessor::parseDefineArguments(Macro *m)
{
    Symbols arguments;
    while (hasNext()) {
        while (test(PP_WHITESPACE)) {}
        Token t = next();
        if (t == PP_RPAREN)
            break;
        if (t != PP_IDENTIFIER) {
            QByteArray l = lexem();
            if (l == "...") {
                m->isVariadic = true;
                arguments += Symbol(symbol().lineNum, PP_IDENTIFIER, "__VA_ARGS__");
                while (test(PP_WHITESPACE)) {}
                if (!test(PP_RPAREN))
                    error("missing ')' in macro argument list");
                break;
            } else if (!is_identifier(l.constData(), l.size())) {
                error("Unexpected character in macro argument list.");
            }
        }

        Symbol arg = symbol();
        if (arguments.contains(arg))
            error("Duplicate macro parameter.");
        arguments += symbol();

        while (test(PP_WHITESPACE)) {}
        t = next();
        if (t == PP_RPAREN)
            break;
        if (t == PP_COMMA)
            continue;
        if (lexem() == "...") {
            //GCC extension:    #define FOO(x, y...) x(y)
            // The last argument was already parsed. Just mark the macro as variadic.
            m->isVariadic = true;
            while (test(PP_WHITESPACE)) {}
            if (!test(PP_RPAREN))
                error("missing ')' in macro argument list");
            break;
        }
        error("Unexpected character in macro argument list.");
    }
    m->arguments = arguments;
    while (test(PP_WHITESPACE)) {}
}